

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

ImageT<unsigned_char,_4U> * __thiscall
ImageT<unsigned_char,4u>::copyTo<ImageT<unsigned_char,3u>>
          (ImageT<unsigned_char,4u> *this,ImageT<unsigned_char,_3U> *dst,string_view swizzle)

{
  undefined8 uVar1;
  Color *pCVar2;
  ulong uVar3;
  uchar uVar4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  uint uVar8;
  uint32_t uVar9;
  ulong uVar10;
  uint32_t c;
  ulong uVar11;
  long lVar12;
  long lVar13;
  
  iVar5 = (**(code **)(*(long *)this + 0x30))(this,dst,swizzle._M_len);
  iVar6 = (*(dst->super_Image)._vptr_Image[6])(dst);
  if (iVar5 != iVar6) {
    __assert_fail("getComponentSize() == dst.getComponentSize()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50a,
                  "ImageT<componentType, componentCount> &ImageT<unsigned char, 4>::copyTo(DstImage &, std::string_view) [componentType = unsigned char, componentCount = 4, DstImage = ImageT<unsigned char, 3>]"
                 );
  }
  uVar7 = *(uint32_t *)(this + 8);
  if ((uVar7 != (dst->super_Image).width) ||
     (uVar9 = *(uint32_t *)(this + 0xc), uVar9 != (dst->super_Image).height)) {
    __assert_fail("width == dst.getWidth() && height == dst.getHeight()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50b,
                  "ImageT<componentType, componentCount> &ImageT<unsigned char, 4>::copyTo(DstImage &, std::string_view) [componentType = unsigned char, componentCount = 4, DstImage = ImageT<unsigned char, 3>]"
                 );
  }
  uVar1 = *(undefined8 *)(this + 0x10);
  (dst->super_Image).transferFunction = (int)uVar1;
  (dst->super_Image).primaries = (int)((ulong)uVar1 >> 0x20);
  lVar13 = 0;
  uVar10 = 0;
  do {
    if (uVar9 * uVar7 <= uVar10) {
      return (ImageT<unsigned_char,_4U> *)this;
    }
    uVar11 = 0;
    lVar12 = lVar13;
    while( true ) {
      uVar8 = (*(dst->super_Image)._vptr_Image[5])(dst);
      if (uVar8 <= uVar11) break;
      uVar8 = (**(code **)(*(long *)this + 0x28))(this);
      if (uVar8 <= uVar11) break;
      pCVar2 = dst->pixels;
      uVar4 = ImageT<unsigned_char,_4U>::swizzlePixel
                        ((ImageT<unsigned_char,_4U> *)this,
                         (Color *)(*(long *)(this + 0x18) + uVar10 * 4),swizzle._M_str[uVar11]);
      uVar3 = 2;
      if ((uint)uVar11 < 2) {
        uVar3 = uVar11;
      }
      pCVar2[uVar10].field_0.comps[uVar3 & 0xffffffff] = uVar4;
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 1;
    }
    while( true ) {
      uVar8 = (*(dst->super_Image)._vptr_Image[5])(dst);
      if (uVar8 <= uVar11) break;
      if (uVar11 < 3) {
        (dst->pixels->field_0).comps[lVar12] = '\0';
      }
      else {
        dst->pixels[uVar10].field_0.comps[2] = 0xff;
      }
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 1;
    }
    uVar10 = uVar10 + 1;
    uVar7 = *(uint32_t *)(this + 8);
    uVar9 = *(uint32_t *)(this + 0xc);
    lVar13 = lVar13 + 3;
  } while( true );
}

Assistant:

ImageT& copyTo(DstImage& dst, std::string_view swizzle) {
        assert(getComponentSize() == dst.getComponentSize());
        assert(width == dst.getWidth() && height == dst.getHeight());

        dst.setTransferFunction(transferFunction);
        dst.setPrimaries(primaries);
        for (size_t i = 0; i < getPixelCount(); i++) {
            uint32_t c;
            for (c = 0; c < dst.getComponentCount(); c++) {
                if (c < getComponentCount())
                    dst.pixels[i].set(c, swizzlePixel(pixels[i], swizzle[c]));
                else
                    break;
            }
            for (; c < dst.getComponentCount(); c++)
                if (c < 3)
                    dst.pixels[i].set(c, componentType{0});
                else
                    dst.pixels[i].set(c, Color::one());
        }
        return *this;
    }